

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O2

bool __thiscall rw::Animation::streamWriteLegacy(Animation *this,Stream *stream)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  long lVar5;
  void *data;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined8 in_XMM1_Qa;
  
  Stream::writeI32(stream,this->numFrames);
  Stream::writeI32(stream,this->flags);
  Stream::writeF32(stream,this->duration);
  pvVar1 = this->keyframes;
  data = (void *)((long)pvVar1 + 0x1c);
  uVar6 = extraout_XMM0_Da;
  uVar7 = extraout_XMM0_Db;
  for (lVar5 = 0; lVar5 < this->numFrames; lVar5 = lVar5 + 1) {
    dVar4 = conj((double)CONCAT44(uVar7,uVar6));
    auVar2._8_4_ = (int)in_XMM1_Qa;
    auVar2._0_8_ = dVar4;
    auVar2._12_4_ = (int)((ulong)in_XMM1_Qa >> 0x20);
    *(undefined1 (*) [16])((long)data + -0x10) = auVar2;
    Stream::write32(stream,(void *)((long)data + -0x10),0x10);
    dVar4 = conj((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    auVar3._8_4_ = (int)in_XMM1_Qa;
    auVar3._0_8_ = dVar4;
    auVar3._12_4_ = (int)((ulong)in_XMM1_Qa >> 0x20);
    *(undefined1 (*) [16])((long)data + -0x10) = auVar3;
    Stream::write32(stream,data,0xc);
    Stream::writeF32(stream,*(float32 *)((long)data + -0x14));
    Stream::writeI32(stream,(int)((*(long *)((long)data + -0x1c) - (long)pvVar1) / 0x28) * 0x24);
    data = (void *)((long)data + 0x28);
    uVar6 = extraout_XMM0_Da_01;
    uVar7 = extraout_XMM0_Db_01;
  }
  return true;
}

Assistant:

bool
Animation::streamWriteLegacy(Stream *stream)
{
	stream->writeI32(this->numFrames);
	stream->writeI32(this->flags);
	stream->writeF32(this->duration);
	assert(interpInfo->id == 1);
	HAnimKeyFrame *frames = (HAnimKeyFrame*)this->keyframes;
	for(int32 i = 0; i < this->numFrames; i++){
		frames[i].q = conj(frames[i].q);
		stream->write32(&frames[i].q, 4*4);
		frames[i].q = conj(frames[i].q);
		stream->write32(&frames[i].t, 3*4);
		stream->writeF32(frames[i].time);
		stream->writeI32((frames[i].prev - frames)*0x24);
	}
	return true;
}